

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asListAnySize(ListBuilder *__return_storage_ptr__,OrphanBuilder *this)

{
  SegmentBuilder *origSegment;
  CapTableBuilder *capTable;
  bool bVar1;
  WirePointer *pWVar2;
  BuilderArena *orphanArena;
  word *pwVar3;
  Fault local_18;
  Fault f;
  OrphanBuilder *this_local;
  
  f.exception = (Exception *)this;
  pWVar2 = tagAsPtr(this);
  bVar1 = WirePointer::isNull(pWVar2);
  if (bVar1 == (this->location == (word *)0x0)) {
    pWVar2 = tagAsPtr(this);
    pwVar3 = this->location;
    origSegment = this->segment;
    capTable = this->capTable;
    orphanArena = SegmentBuilder::getArena(this->segment);
    WireHelpers::getWritableListPointerAnySize
              (__return_storage_ptr__,pWVar2,pwVar3,origSegment,capTable,(word *)0x0,orphanArena);
    pwVar3 = ListBuilder::getLocation(__return_storage_ptr__);
    this->location = pwVar3;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xdf0,FAILED,"tagAsPtr()->isNull() == (location == nullptr)","");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

ListBuilder OrphanBuilder::asListAnySize() {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableListPointerAnySize(
      tagAsPtr(), location, segment, capTable, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = result.getLocation();

  return result;
}